

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluVarType.cpp
# Opt level: O1

bool __thiscall glu::VarType::operator==(VarType *this,VarType *other)

{
  Type TVar1;
  bool bVar2;
  
  TVar1 = this->m_type;
  if (TVar1 == other->m_type) {
    if (TVar1 == TYPE_STRUCT) {
      bVar2 = (this->m_data).array.elementType == (other->m_data).array.elementType;
    }
    else if (TVar1 == TYPE_ARRAY) {
      bVar2 = operator==((this->m_data).array.elementType,(other->m_data).array.elementType);
      bVar2 = (this->m_data).array.size == (other->m_data).array.size && bVar2;
    }
    else if (TVar1 == TYPE_BASIC) {
      bVar2 = (other->m_data).basic.precision == (this->m_data).basic.precision &&
              (this->m_data).basic.type == (other->m_data).basic.type;
    }
    else {
      bVar2 = false;
    }
    return bVar2;
  }
  return false;
}

Assistant:

bool VarType::operator== (const VarType& other) const
{
	if (m_type != other.m_type)
		return false;

	switch (m_type)
	{
		case TYPE_BASIC:
			return	m_data.basic.type == other.m_data.basic.type &&
					m_data.basic.precision == other.m_data.basic.precision;

		case TYPE_ARRAY:
			return	*m_data.array.elementType == *other.m_data.array.elementType &&
					m_data.array.size == other.m_data.array.size;

		case TYPE_STRUCT:
			return m_data.structPtr == other.m_data.structPtr;

		default:
			DE_ASSERT(false);
			return 0;
	}
}